

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::IsChrpathUsed(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  LinkClosure *pLVar7;
  char *pcVar8;
  bool bVar9;
  string ll;
  string sepVar;
  string local_90;
  string local_70;
  string local_50;
  
  TVar2 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar2) {
    return false;
  }
  if (TVar2 == STATIC_LIBRARY) {
    return false;
  }
  if (this->Target->HaveInstallRule != true) {
    return false;
  }
  pcVar3 = this->Makefile;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_SKIP_RPATH","");
  bVar5 = cmMakefile::IsOn(pcVar3,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    return false;
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BUILD_WITH_INSTALL_RPATH","")
  ;
  bVar5 = cmTarget::GetPropertyAsBool(this->Target,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    return false;
  }
  pcVar3 = this->Makefile;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_NO_BUILTIN_CHRPATH","")
  ;
  bVar5 = cmMakefile::IsOn(pcVar3,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    return false;
  }
  pcVar3 = this->Makefile;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar5 = cmMakefile::IsOn(pcVar3,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  bVar9 = true;
  if (bVar5) {
    return true;
  }
  pLVar7 = GetLinkClosure(this,config);
  pcVar4 = (pLVar7->LinkerLanguage)._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + (pLVar7->LinkerLanguage)._M_string_length);
  if (local_90._M_string_length != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CMAKE_SHARED_LIBRARY_RUNTIME_","");
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_70);
    pcVar8 = cmMakefile::GetDefinition(this->Makefile,&local_70);
    bVar5 = true;
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      pcVar3 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"CMAKE_EXECUTABLE_FORMAT","");
      pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (pcVar8 != (char *)0x0) {
        iVar6 = strcmp(pcVar8,"ELF");
        bVar9 = iVar6 == 0;
        bVar5 = false;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_003ba08a;
  }
  bVar9 = false;
LAB_003ba08a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    return bVar9;
  }
  return bVar9;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}